

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::BaseAtomTypesSectionParser::parseLine
          (BaseAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  AtomType *this_00;
  SimpleTypeData<double> *__p;
  RealType m;
  string baseAtomTypeName;
  StringTokenizer tokenizer;
  string local_e0;
  double local_c0;
  shared_ptr<OpenMD::GenericData> local_b8;
  string local_a8;
  StringTokenizer local_88;
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_88,line,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  iVar3 = StringTokenizer::countTokens(&local_88);
  if (iVar3 < 2) {
    snprintf(painCave.errMsg,2000,"BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n"
             ,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_88);
    this_00 = ForceField::getAtomType(ff,&local_e0);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
      AtomType::setName(this_00,&local_e0);
      ForceField::addAtomType(ff,&local_e0,this_00);
    }
    m = StringTokenizer::nextTokenAsDouble(&local_88);
    AtomType::setMass(this_00,m);
    bVar2 = StringTokenizer::hasMoreTokens(&local_88);
    if (bVar2) {
      local_c0 = StringTokenizer::nextTokenAsDouble(&local_88);
      __p = (SimpleTypeData<double> *)operator_new(0x30);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"nelectron","");
      GenericData::GenericData((GenericData *)__p,&local_a8);
      (__p->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_00227900;
      __p->data_ = local_c0;
      local_b8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<OpenMD::SimpleTypeData<double>*>
                (&local_b8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,__p);
      AtomType::addProperty(this_00,&local_b8);
      if (local_b8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
    operator_delete(local_88.delim_._M_dataplus._M_p,
                    local_88.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
    operator_delete(local_88.tokenString_._M_dataplus._M_p,
                    local_88.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BaseAtomTypesSectionParser::parseLine(ForceField& ff,
                                             const std::string& line,
                                             int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in BaseAtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string baseAtomTypeName = tokenizer.nextToken();
      AtomType* baseAtomType       = ff.getAtomType(baseAtomTypeName);

      if (baseAtomType == NULL) {
        baseAtomType = new AtomType();
        int ident    = ff.getNAtomType();
        baseAtomType->setIdent(ident);
        baseAtomType->setName(baseAtomTypeName);
        ff.addAtomType(baseAtomTypeName, baseAtomType);
      }

      //    else {
      //         snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //         "BaseAtomTypesSectionParser Error: Duplicate BaseAtomType at
      //         line %d\n",
      //                 lineNo);
      //         painCave.isFatal = 1;
      //         simError();
      //       }

      RealType mass = tokenizer.nextTokenAsDouble();
      baseAtomType->setMass(mass);
      if (tokenizer.hasMoreTokens()) {
        RealType nelectron = tokenizer.nextTokenAsDouble();
        baseAtomType->addProperty(std::shared_ptr<GenericData>(
            new DoubleGenericData("nelectron", nelectron)));
      }
    }
  }